

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode NodeId_encodeBinaryWithEncodingMask(UA_NodeId *src,UA_Byte encoding)

{
  UA_StatusCode UVar1;
  UA_Byte local_25;
  UA_UInt16 local_24;
  UA_Byte local_21;
  uint uStack_20;
  UA_Byte identifier8;
  UA_UInt16 identifier16;
  UA_Byte nsindex;
  UA_StatusCode retval;
  UA_Byte encoding_local;
  UA_NodeId *src_local;
  
  uStack_20 = 0;
  _retval = src;
  switch(src->identifierType) {
  case UA_NODEIDTYPE_NUMERIC:
    if (((src->identifier).numeric < 0x10000) && (src->namespaceIndex < 0x100)) {
      if (((src->identifier).numeric < 0x100) && (src->namespaceIndex == 0)) {
        nsindex = encoding;
        UVar1 = Byte_encodeBinary(&nsindex,(UA_DataType *)0x0);
        uStack_20 = UVar1 | uStack_20;
        local_25 = (UA_Byte)(_retval->identifier).numeric;
        UVar1 = Byte_encodeBinary(&local_25,(UA_DataType *)0x0);
        uStack_20 = UVar1 | uStack_20;
      }
      else {
        nsindex = encoding | 1;
        UVar1 = Byte_encodeBinary(&nsindex,(UA_DataType *)0x0);
        uStack_20 = UVar1 | uStack_20;
        local_21 = (UA_Byte)_retval->namespaceIndex;
        UVar1 = Byte_encodeBinary(&local_21,(UA_DataType *)0x0);
        uStack_20 = UVar1 | uStack_20;
        local_24 = (UA_UInt16)(_retval->identifier).numeric;
        UVar1 = UInt16_encodeBinary(&local_24,(UA_DataType *)0x0);
        uStack_20 = UVar1 | uStack_20;
      }
    }
    else {
      nsindex = encoding | 2;
      UVar1 = Byte_encodeBinary(&nsindex,(UA_DataType *)0x0);
      uStack_20 = UVar1 | uStack_20;
      UVar1 = UInt16_encodeBinary(&_retval->namespaceIndex,(UA_DataType *)0x0);
      uStack_20 = UVar1 | uStack_20;
      UVar1 = UInt32_encodeBinary(&(_retval->identifier).numeric,(UA_DataType *)0x0);
      uStack_20 = UVar1 | uStack_20;
    }
    break;
  default:
    return 0x80020000;
  case UA_NODEIDTYPE_STRING:
    nsindex = encoding | 3;
    UVar1 = Byte_encodeBinary(&nsindex,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    UVar1 = UInt16_encodeBinary(&_retval->namespaceIndex,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    UVar1 = String_encodeBinary(&(_retval->identifier).string,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    break;
  case UA_NODEIDTYPE_GUID:
    nsindex = encoding | 4;
    UVar1 = Byte_encodeBinary(&nsindex,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    UVar1 = UInt16_encodeBinary(&_retval->namespaceIndex,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    UVar1 = Guid_encodeBinary(&(_retval->identifier).guid,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    break;
  case UA_NODEIDTYPE_BYTESTRING:
    nsindex = encoding | 5;
    UVar1 = Byte_encodeBinary(&nsindex,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    UVar1 = UInt16_encodeBinary(&_retval->namespaceIndex,(UA_DataType *)0x0);
    uStack_20 = UVar1 | uStack_20;
    UVar1 = ByteString_encodeBinary(&(_retval->identifier).byteString);
    uStack_20 = UVar1 | uStack_20;
  }
  return uStack_20;
}

Assistant:

static UA_StatusCode
NodeId_encodeBinaryWithEncodingMask(UA_NodeId const *src, UA_Byte encoding) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch (src->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        if(src->identifier.numeric > UA_UINT16_MAX || src->namespaceIndex > UA_BYTE_MAX) {
            encoding |= UA_NODEIDTYPE_NUMERIC_COMPLETE;
            retval |= Byte_encodeBinary(&encoding, NULL);
            retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
            retval |= UInt32_encodeBinary(&src->identifier.numeric, NULL);
        } else if(src->identifier.numeric > UA_BYTE_MAX || src->namespaceIndex > 0) {
            encoding |= UA_NODEIDTYPE_NUMERIC_FOURBYTE;
            retval |= Byte_encodeBinary(&encoding, NULL);
            UA_Byte nsindex = (UA_Byte)src->namespaceIndex;
            retval |= Byte_encodeBinary(&nsindex, NULL);
            UA_UInt16 identifier16 = (UA_UInt16)src->identifier.numeric;
            retval |= UInt16_encodeBinary(&identifier16, NULL);
        } else {
            encoding |= UA_NODEIDTYPE_NUMERIC_TWOBYTE;
            retval |= Byte_encodeBinary(&encoding, NULL);
            UA_Byte identifier8 = (UA_Byte)src->identifier.numeric;
            retval |= Byte_encodeBinary(&identifier8, NULL);
        }
        break;
    case UA_NODEIDTYPE_STRING:
        encoding |= UA_NODEIDTYPE_STRING;
        retval |= Byte_encodeBinary(&encoding, NULL);
        retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
        retval |= String_encodeBinary(&src->identifier.string, NULL);
        break;
    case UA_NODEIDTYPE_GUID:
        encoding |= UA_NODEIDTYPE_GUID;
        retval |= Byte_encodeBinary(&encoding, NULL);
        retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
        retval |= Guid_encodeBinary(&src->identifier.guid, NULL);
        break;
    case UA_NODEIDTYPE_BYTESTRING:
        encoding |= UA_NODEIDTYPE_BYTESTRING;
        retval |= Byte_encodeBinary(&encoding, NULL);
        retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
        retval |= ByteString_encodeBinary(&src->identifier.byteString);
        break;
    default:
        return UA_STATUSCODE_BADINTERNALERROR;
    }
    return retval;
}